

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_io_dp.c
# Opt level: O0

void * gdDPExtractData(gdIOCtx *ctx,int *size)

{
  dynamicPtr *dp_00;
  void *local_30;
  void *data;
  dpIOCtx *dctx;
  dynamicPtr *dp;
  int *size_local;
  gdIOCtx *ctx_local;
  
  dp_00 = (dynamicPtr *)ctx[1].getC;
  if (dp_00->dataGood == 0) {
    *size = 0;
    local_30 = (void *)0x0;
    if ((dp_00->data != (void *)0x0) && (dp_00->freeOK != 0)) {
      gdFree(dp_00->data);
    }
  }
  else {
    trimDynamic(dp_00);
    *size = dp_00->logicalSize;
    local_30 = dp_00->data;
  }
  dp_00->data = (void *)0x0;
  dp_00->realSize = 0;
  dp_00->logicalSize = 0;
  return local_30;
}

Assistant:

BGD_DECLARE(void *) gdDPExtractData (struct gdIOCtx *ctx, int *size)
{
	dynamicPtr *dp;
	dpIOCtx *dctx;
	void *data;

	dctx = (dpIOCtx *)ctx;
	dp = dctx->dp;

	/* clean up the data block and return it */
	if(dp->dataGood) {
		trimDynamic(dp);
		*size = dp->logicalSize;
		data = dp->data;
	} else {
		*size = 0;
		data = NULL;
		/* 2.0.21: never free memory we don't own */
		if((dp->data != NULL) && (dp->freeOK)) {
			gdFree(dp->data);
		}
	}

	dp->data = NULL;
	dp->realSize = 0;
	dp->logicalSize = 0;

	return data;
}